

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall FFont::LoadTranslations(FFont *this)

{
  int iVar1;
  FTexture *pic;
  long *plVar2;
  BYTE *pBVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double *luminosity;
  BYTE identity [256];
  BYTE usedcolors [256];
  double *local_230;
  BYTE local_228 [256];
  BYTE local_128 [256];
  
  iVar4 = this->LastChar;
  iVar1 = this->FirstChar;
  memset(local_128,0,0x100);
  lVar5 = (ulong)((iVar4 - iVar1) + 1) << 4;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 0x10) {
    pic = *(FTexture **)((long)&this->Chars->Pic + lVar6);
    if (pic != (FTexture *)0x0) {
      (*pic->_vptr_FTexture[9])(pic);
      pic[1].Scale.X = 0.0;
      RecordTextureColors(pic,local_128);
    }
  }
  iVar4 = SimpleTranslation(local_128,this->PatchRemap,local_228,&local_230);
  this->ActiveColors = iVar4;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 0x10) {
    plVar2 = *(long **)((long)&this->Chars->Pic + lVar6);
    if (plVar2 != (long *)0x0) {
      pBVar3 = this->PatchRemap;
      (**(code **)(*plVar2 + 0x48))(plVar2);
      plVar2[0xd] = (long)pBVar3;
    }
  }
  BuildTranslations(this,local_230,local_228,TranslationParms[0].Array,this->ActiveColors,
                    (PalEntry *)0x0);
  if (local_230 != (double *)0x0) {
    operator_delete__(local_230);
  }
  return;
}

Assistant:

void FFont::LoadTranslations()
{
	unsigned int count = LastChar - FirstChar + 1;
	BYTE usedcolors[256], identity[256];
	double *luminosity;

	memset (usedcolors, 0, 256);
	for (unsigned int i = 0; i < count; i++)
	{
		FFontChar1 *pic = static_cast<FFontChar1 *>(Chars[i].Pic);
		if(pic)
		{
			pic->SetSourceRemap(NULL); // Force the FFontChar1 to return the same pixels as the base texture
			RecordTextureColors (pic, usedcolors);
		}
	}

	ActiveColors = SimpleTranslation (usedcolors, PatchRemap, identity, &luminosity);

	for (unsigned int i = 0; i < count; i++)
	{
		if(Chars[i].Pic)
			static_cast<FFontChar1 *>(Chars[i].Pic)->SetSourceRemap(PatchRemap);
	}

	BuildTranslations (luminosity, identity, &TranslationParms[0][0], ActiveColors, NULL);

	delete[] luminosity;
}